

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void ContextBlockSplitterStoredFinishBlockLiterals
               (ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  uint uVar1;
  BlockSplit *pBVar2;
  ulong uVar3;
  HistogramLiteral *pHVar4;
  size_t sVar5;
  ulong uVar6;
  ContextBlockSplitter *pCVar7;
  HistogramLiteral *pHVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  void *local_300;
  void *local_2e0;
  size_t curr_histo_ix_1;
  size_t i_4;
  double combined_entropy_1 [13];
  HistogramLiteral *combined_histo_1;
  size_t curr_histo_ix;
  size_t i_1;
  double combined_entropy [13];
  HistogramLiteral *combined_histo;
  uint8_t current_type;
  HistogramLiteral *histograms;
  size_t num_contexts;
  BlockSplit *split;
  int is_final_local;
  MemoryManager *m_local;
  ContextBlockSplitter *self_local;
  size_t i_3;
  ulong local_180;
  size_t i;
  ulong local_148;
  size_t i_5;
  ulong local_130;
  size_t i_2;
  uint32_t *local_118;
  double retval_2;
  size_t sum_2;
  uint *local_100;
  uint32_t *local_f8;
  double retval;
  size_t sum;
  uint *local_e0;
  ulong local_d8;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  ulong local_b0;
  uint *local_a8;
  ulong local_a0;
  size_t p_1;
  uint32_t *population_end_1;
  double retval_3;
  size_t sum_3;
  ulong local_78;
  uint *local_70;
  ulong local_68;
  double local_60;
  ulong local_58;
  double local_50;
  double local_48;
  double local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  double local_20;
  double local_18;
  double local_10;
  undefined4 uVar27;
  undefined4 uVar28;
  
  pBVar2 = self->split_;
  uVar3 = self->num_contexts_;
  pHVar4 = self->histograms_;
  if (self->num_blocks_ == 0) {
    self->num_blocks_ = self->num_blocks_ + 1;
    self->num_types_ = self->num_types_ + 1;
    self->curr_histogram_ix_ = uVar3 + self->curr_histogram_ix_;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      pHVar4 = self->histograms_;
      sVar5 = self->curr_histogram_ix_;
      uVar6 = self->num_contexts_;
      for (local_180 = 0; local_180 < uVar6; local_180 = local_180 + 1) {
        pHVar8 = pHVar4 + sVar5 + local_180;
        memset(pHVar8,0,0x400);
        pHVar8->total_count_ = 0;
        pHVar8->bit_cost_ = INFINITY;
      }
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    combined_histo._7_1_ = pBVar2->types[self->num_blocks_];
    if (pBVar2->num_types <= (ulong)combined_histo._7_1_) {
      combined_histo._7_1_ = 0;
    }
    if ((uint)combined_histo._7_1_ == ((uint)self->num_types_ & 0xff)) {
      if (self->num_types_ < self->max_block_types_) {
        self->num_blocks_ = self->num_blocks_ + 1;
        self->num_types_ = self->num_types_ + 1;
        self->curr_histogram_ix_ = uVar3 + self->curr_histogram_ix_;
        if (self->curr_histogram_ix_ < *self->histograms_size_) {
          pHVar4 = self->histograms_;
          sVar5 = self->curr_histogram_ix_;
          pCVar7 = (ContextBlockSplitter *)self->num_contexts_;
          for (self_local = (ContextBlockSplitter *)0x0; self_local < pCVar7;
              self_local = (ContextBlockSplitter *)((long)&self_local->alphabet_size_ + 1)) {
            pHVar8 = pHVar4 + (long)self_local->last_histogram_ix_ + (sVar5 - 0x68);
            memset(pHVar8,0,0x400);
            pHVar8->total_count_ = 0;
            pHVar8->bit_cost_ = INFINITY;
          }
        }
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
      else {
        pBVar2->types[self->num_blocks_] = '\0';
        if (uVar3 == 0) {
          local_2e0 = (void *)0x0;
        }
        else {
          local_2e0 = BrotliAllocate(m,uVar3 * 0x410);
        }
        for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
          memcpy((void *)((long)local_2e0 + curr_histo_ix * 0x410),
                 pHVar4 + self->curr_histogram_ix_ + curr_histo_ix,0x410);
          *(size_t *)((long)local_2e0 + curr_histo_ix * 0x410 + 0x400) =
               pHVar4[curr_histo_ix].total_count_ +
               *(long *)((long)local_2e0 + curr_histo_ix * 0x410 + 0x400);
          for (local_130 = 0; local_130 < 0x100; local_130 = local_130 + 1) {
            *(uint32_t *)((long)local_2e0 + local_130 * 4 + curr_histo_ix * 0x410) =
                 pHVar4[curr_histo_ix].data_[local_130] +
                 *(int *)((long)local_2e0 + local_130 * 4 + curr_histo_ix * 0x410);
          }
          local_e0 = (uint *)((long)local_2e0 + curr_histo_ix * 0x410);
          sum = self->alphabet_size_;
          sum_1 = (size_t)&retval;
          retval_1 = 0.0;
          population_end = (uint32_t *)0x0;
          p = (size_t)(local_e0 + sum);
          local_b0 = sum;
          local_a8 = local_e0;
          if ((sum & 1) == 0) goto LAB_0019f888;
          while( true ) {
            uVar1 = *local_a8;
            local_d8 = CONCAT44(0,uVar1);
            retval_1 = (double)((long)retval_1 + local_d8);
            auVar13._8_4_ = 0;
            auVar13._0_8_ = local_d8;
            auVar13._12_4_ = 0x45300000;
            local_38 = local_d8;
            if (local_d8 < 0x100) {
              local_30 = kLog2Table[local_d8];
              local_a8 = local_a8 + 1;
            }
            else {
              auVar14._8_4_ = 0;
              auVar14._0_8_ = local_d8;
              auVar14._12_4_ = 0x45300000;
              local_a8 = local_a8 + 1;
              local_30 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
            }
            population_end =
                 (uint32_t *)
                 (-((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_30 +
                 (double)population_end);
LAB_0019f888:
            if (p <= local_a8) break;
            uVar1 = *local_a8;
            local_d8 = CONCAT44(0,uVar1);
            retval_1 = (double)((long)retval_1 + local_d8);
            auVar11._8_4_ = 0;
            auVar11._0_8_ = local_d8;
            auVar11._12_4_ = 0x45300000;
            local_28 = local_d8;
            if (local_d8 < 0x100) {
              local_20 = kLog2Table[local_d8];
              local_a8 = local_a8 + 1;
            }
            else {
              auVar12._8_4_ = 0;
              auVar12._0_8_ = local_d8;
              auVar12._12_4_ = 0x45300000;
              local_a8 = local_a8 + 1;
              local_20 = log2((auVar12._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
            }
            population_end =
                 (uint32_t *)
                 (-((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_20 +
                 (double)population_end);
          }
          if (retval_1 != 0.0) {
            uVar27 = (undefined4)((ulong)retval_1 >> 0x20);
            auVar15._8_4_ = uVar27;
            auVar15._0_8_ = retval_1;
            auVar15._12_4_ = 0x45300000;
            uVar28 = SUB84(retval_1,0);
            local_18 = retval_1;
            if ((ulong)retval_1 < 0x100) {
              local_10 = kLog2Table[(long)retval_1];
            }
            else {
              auVar16._8_4_ = uVar27;
              auVar16._0_8_ = retval_1;
              auVar16._12_4_ = 0x45300000;
              local_10 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar28) - 4503599627370496.0));
            }
            population_end =
                 (uint32_t *)
                 (((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar28) - 4503599627370496.0)) * local_10 +
                 (double)population_end);
          }
          *(double *)sum_1 = retval_1;
          local_f8 = population_end;
          uVar28 = (undefined4)((ulong)retval >> 0x20);
          auVar17._8_4_ = uVar28;
          auVar17._0_8_ = retval;
          auVar17._12_4_ = 0x45300000;
          if ((double)population_end <
              (auVar17._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
            auVar18._8_4_ = uVar28;
            auVar18._0_8_ = retval;
            auVar18._12_4_ = 0x45300000;
            local_f8 = (uint32_t *)
                       ((auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0));
          }
          combined_entropy[curr_histo_ix - 1] = (double)local_f8;
        }
        for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
          memcpy(pHVar4 + curr_histo_ix,(void *)((long)local_2e0 + curr_histo_ix * 0x410),0x410);
          pHVar8 = pHVar4 + self->curr_histogram_ix_ + curr_histo_ix;
          memset(pHVar8,0,0x400);
          pHVar8->total_count_ = 0;
          pHVar8->bit_cost_ = INFINITY;
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        pBVar2->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BrotliFree(m,local_2e0);
      }
    }
    else {
      if (uVar3 == 0) {
        local_300 = (void *)0x0;
      }
      else {
        local_300 = BrotliAllocate(m,uVar3 * 0x410);
      }
      combined_entropy_1[0xc] = (double)local_300;
      for (curr_histo_ix_1 = 0; curr_histo_ix_1 < uVar3; curr_histo_ix_1 = curr_histo_ix_1 + 1) {
        memcpy((void *)((long)combined_entropy_1[0xc] + curr_histo_ix_1 * 0x410),
               pHVar4 + self->curr_histogram_ix_ + curr_histo_ix_1,0x410);
        lVar9 = (long)combined_entropy_1[0xc] + curr_histo_ix_1 * 0x410;
        lVar10 = combined_histo._7_1_ * uVar3 + curr_histo_ix_1;
        *(size_t *)(lVar9 + 0x400) = pHVar4[lVar10].total_count_ + *(long *)(lVar9 + 0x400);
        for (local_148 = 0; local_148 < 0x100; local_148 = local_148 + 1) {
          *(uint32_t *)(lVar9 + local_148 * 4) =
               pHVar4[lVar10].data_[local_148] + *(int *)(lVar9 + local_148 * 4);
        }
        local_100 = (uint *)((long)combined_entropy_1[0xc] + curr_histo_ix_1 * 0x410);
        sum_2 = self->alphabet_size_;
        sum_3 = (size_t)&retval_2;
        retval_3 = 0.0;
        population_end_1 = (uint32_t *)0x0;
        p_1 = (size_t)(local_100 + sum_2);
        local_78 = sum_2;
        local_70 = local_100;
        if ((sum_2 & 1) == 0) goto LAB_001a00a6;
        while( true ) {
          uVar1 = *local_70;
          local_a0 = CONCAT44(0,uVar1);
          retval_3 = (double)((long)retval_3 + local_a0);
          auVar21._8_4_ = 0;
          auVar21._0_8_ = local_a0;
          auVar21._12_4_ = 0x45300000;
          local_68 = local_a0;
          if (local_a0 < 0x100) {
            local_60 = kLog2Table[local_a0];
            local_70 = local_70 + 1;
          }
          else {
            auVar22._8_4_ = 0;
            auVar22._0_8_ = local_a0;
            auVar22._12_4_ = 0x45300000;
            local_70 = local_70 + 1;
            local_60 = log2((auVar22._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          population_end_1 =
               (uint32_t *)
               (-((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_60 +
               (double)population_end_1);
LAB_001a00a6:
          if (p_1 <= local_70) break;
          uVar1 = *local_70;
          local_a0 = CONCAT44(0,uVar1);
          retval_3 = (double)((long)retval_3 + local_a0);
          auVar19._8_4_ = 0;
          auVar19._0_8_ = local_a0;
          auVar19._12_4_ = 0x45300000;
          local_58 = local_a0;
          if (local_a0 < 0x100) {
            local_50 = kLog2Table[local_a0];
            local_70 = local_70 + 1;
          }
          else {
            auVar20._8_4_ = 0;
            auVar20._0_8_ = local_a0;
            auVar20._12_4_ = 0x45300000;
            local_70 = local_70 + 1;
            local_50 = log2((auVar20._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          population_end_1 =
               (uint32_t *)
               (-((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_50 +
               (double)population_end_1);
        }
        if (retval_3 != 0.0) {
          uVar27 = (undefined4)((ulong)retval_3 >> 0x20);
          auVar23._8_4_ = uVar27;
          auVar23._0_8_ = retval_3;
          auVar23._12_4_ = 0x45300000;
          uVar28 = SUB84(retval_3,0);
          local_48 = retval_3;
          if ((ulong)retval_3 < 0x100) {
            local_40 = kLog2Table[(long)retval_3];
          }
          else {
            auVar24._8_4_ = uVar27;
            auVar24._0_8_ = retval_3;
            auVar24._12_4_ = 0x45300000;
            local_40 = log2((auVar24._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar28) - 4503599627370496.0));
          }
          population_end_1 =
               (uint32_t *)
               (((auVar23._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar28) - 4503599627370496.0)) * local_40 +
               (double)population_end_1);
        }
        *(double *)sum_3 = retval_3;
        local_118 = population_end_1;
        uVar28 = (undefined4)((ulong)retval_2 >> 0x20);
        auVar25._8_4_ = uVar28;
        auVar25._0_8_ = retval_2;
        auVar25._12_4_ = 0x45300000;
        if ((double)population_end_1 <
            (auVar25._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(retval_2,0)) - 4503599627370496.0)) {
          auVar26._8_4_ = uVar28;
          auVar26._0_8_ = retval_2;
          auVar26._12_4_ = 0x45300000;
          local_118 = (uint32_t *)
                      ((auVar26._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,SUB84(retval_2,0)) - 4503599627370496.0));
        }
        combined_entropy_1[curr_histo_ix_1 - 1] = (double)local_118;
      }
      pBVar2->types[self->num_blocks_] = combined_histo._7_1_;
      for (curr_histo_ix_1 = 0; curr_histo_ix_1 < uVar3; curr_histo_ix_1 = curr_histo_ix_1 + 1) {
        memcpy(pHVar4 + combined_histo._7_1_ * uVar3 + curr_histo_ix_1,
               (void *)((long)combined_entropy_1[0xc] + curr_histo_ix_1 * 0x410),0x410);
        pHVar8 = pHVar4 + self->curr_histogram_ix_ + curr_histo_ix_1;
        memset(pHVar8,0,0x400);
        pHVar8->total_count_ = 0;
        pHVar8->bit_cost_ = INFINITY;
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BrotliFree(m,(void *)combined_entropy_1[0xc]);
    }
  }
  if (is_final != 0) {
    *self->histograms_size_ = pBVar2->num_types * uVar3;
  }
  return;
}

Assistant:

static void ContextBlockSplitterStoredFinishBlockLiterals(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  HistogramLiteral* histograms = self->histograms_;
  if (self->num_blocks_ == 0) {
    /* Create a first block */
    ++self->num_blocks_;
    ++self->num_types_;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    uint8_t current_type = split->types[self->num_blocks_];
    if (current_type >= split->num_types) {
      current_type = 0;
    }

    if (current_type == (uint8_t)self->num_types_) {
      /* If max_block_types_ amount is reached merge with a block of type 0 */
      if (self->num_types_ >= self->max_block_types_) {
        current_type = 0;
        split->types[self->num_blocks_] = 0;
        /* Merge with the blocks of the same 0 block type */
        HistogramLiteral* combined_histo =
            BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
        double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
        size_t i;
        if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

        for (i = 0; i < num_contexts; ++i) {
          size_t curr_histo_ix = self->curr_histogram_ix_ + i;
          combined_histo[i] = histograms[curr_histo_ix];
          HistogramAddHistogramLiteral(&combined_histo[i],
              &histograms[current_type * num_contexts + i]);
          combined_entropy[i] = BitsEntropy(
              &combined_histo[i].data_[0], self->alphabet_size_);
        }

        for (i = 0; i < num_contexts; ++i) {
          histograms[current_type * num_contexts + i] =
              combined_histo[i];
          HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
        }
        ++self->num_blocks_;
        split->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BROTLI_FREE(m, combined_histo);
      } else {
        /* Create a new block type */
        ++self->num_blocks_;
        ++self->num_types_;
        self->curr_histogram_ix_ += num_contexts;
        if (self->curr_histogram_ix_ < *self->histograms_size_) {
          ClearHistogramsLiteral(
              &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
        }

        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
    } else {
      /* Merge with the blocks of the same current_type block type */
      HistogramLiteral* combined_histo =
          BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
      double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
      size_t i;
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

      for (i = 0; i < num_contexts; ++i) {
        size_t curr_histo_ix = self->curr_histogram_ix_ + i;
        combined_histo[i] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[i],
            &histograms[current_type * num_contexts + i]);
        combined_entropy[i] = BitsEntropy(
            &combined_histo[i].data_[0], self->alphabet_size_);
      }
      split->types[self->num_blocks_] = current_type;
      for (i = 0; i < num_contexts; ++i) {
        histograms[current_type * num_contexts + i] =
            combined_histo[i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BROTLI_FREE(m, combined_histo);
    }
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
  }
}